

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_suffix_array.hpp
# Opt level: O0

bool check_lcp<unsigned_long>
               (string *str,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  void *this;
  const_reference pvVar5;
  reference pvVar6;
  ulong local_68;
  size_t i;
  bool all_correct;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ref_LCP;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *SA_local;
  string *str_local;
  
  ref_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)LCP;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  lcp_from_sa<unsigned_long>
            (str,SA,ISA,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ref_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  if (sVar2 == sVar3) {
    i._7_1_ = true;
    local_68 = 0;
    while( true ) {
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ref_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar2 <= local_68) break;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          ref_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_68);
      vVar1 = *pvVar5;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,local_68
                         );
      if (vVar1 != *pvVar6) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] LCP[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_68);
        poVar4 = std::operator<<(poVar4,"]=");
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            ref_LCP.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_68);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
        poVar4 = std::operator<<(poVar4," != ");
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                            local_68);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar6);
        poVar4 = std::operator<<(poVar4,"=ref_LCP[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_68);
        poVar4 = std::operator<<(poVar4,"]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        i._7_1_ = false;
      }
      local_68 = local_68 + 1;
    }
    str_local._7_1_ = i._7_1_;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] LCP size is wrong: ");
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ref_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    poVar4 = std::operator<<(poVar4,"!=");
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
    this = (void *)std::ostream::operator<<(poVar4,sVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    str_local._7_1_ = false;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  return str_local._7_1_;
}

Assistant:

bool check_lcp(const std::string& str, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, const std::vector<index_t>& LCP)
{
    // construct reference LCP (sequentially)
    std::vector<index_t> ref_LCP;
    lcp_from_sa(str, SA, ISA, ref_LCP);

    // check if reference is equal to this LCP
    if (LCP.size() != ref_LCP.size())
    {
        std::cerr << "[ERROR] LCP size is wrong: " << LCP.size() << "!=" << ref_LCP.size() << std::endl;
        return false;
    }
    // check that all LCP values are equal
    bool all_correct = true;
    for (std::size_t i = 0; i < LCP.size(); ++i)
    {
        if (LCP[i] != ref_LCP[i])
        {
            std::cerr << "[ERROR] LCP[" << i << "]=" << LCP[i] << " != " << ref_LCP[i] << "=ref_LCP[" << i << "]" << std::endl;
            all_correct = false;
        }
    }
    return all_correct;
}